

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O0

StringTree * __thiscall
kj::StringTree::concat<kj::CappedArray<char,5ul>>
          (StringTree *__return_storage_ptr__,StringTree *this,CappedArray<char,_5UL> *params)

{
  size_t sVar1;
  CappedArray<char,_5UL> *pCVar2;
  char *pos;
  size_type extraout_RDX;
  size_type extraout_RDX_00;
  size_type extraout_RDX_01;
  initializer_list<unsigned_long> nums;
  initializer_list<unsigned_long> nums_00;
  initializer_list<unsigned_long> nums_01;
  size_t local_a8;
  _ *local_a0;
  undefined8 local_98;
  Array<kj::StringTree::Branch> local_90;
  size_t local_68;
  _ *local_60;
  undefined8 local_58;
  String local_50;
  size_t local_38;
  _ *local_30;
  undefined8 local_28;
  undefined1 local_19;
  StringTree *local_18;
  CappedArray<char,_5UL> *params_local;
  StringTree *result;
  
  local_19 = 0;
  local_18 = this;
  params_local = (CappedArray<char,_5UL> *)__return_storage_ptr__;
  StringTree(__return_storage_ptr__);
  local_38 = CappedArray<char,_5UL>::size((CappedArray<char,_5UL> *)local_18);
  local_30 = (_ *)&local_38;
  local_28 = 1;
  nums._M_len = extraout_RDX;
  nums._M_array = (iterator)0x1;
  sVar1 = _::sum(local_30,nums);
  __return_storage_ptr__->size_ = sVar1;
  pCVar2 = fwd<kj::CappedArray<char,5ul>>((NoInfer<kj::CappedArray<char,_5UL>_> *)local_18);
  local_68 = flatSize<kj::CappedArray<char,5ul>>(pCVar2);
  local_60 = (_ *)&local_68;
  local_58 = 1;
  nums_00._M_len = extraout_RDX_00;
  nums_00._M_array = (iterator)0x1;
  sVar1 = _::sum(local_60,nums_00);
  heapString(&local_50,sVar1);
  String::operator=(&__return_storage_ptr__->text,&local_50);
  String::~String(&local_50);
  pCVar2 = fwd<kj::CappedArray<char,5ul>>((NoInfer<kj::CappedArray<char,_5UL>_> *)local_18);
  local_a8 = branchCount<kj::CappedArray<char,5ul>>(pCVar2);
  local_a0 = (_ *)&local_a8;
  local_98 = 1;
  nums_01._M_len = extraout_RDX_01;
  nums_01._M_array = (iterator)0x1;
  sVar1 = _::sum(local_a0,nums_01);
  heapArray<kj::StringTree::Branch>(&local_90,sVar1);
  Array<kj::StringTree::Branch>::operator=(&__return_storage_ptr__->branches,&local_90);
  Array<kj::StringTree::Branch>::~Array(&local_90);
  pos = String::begin(&__return_storage_ptr__->text);
  pCVar2 = fwd<kj::CappedArray<char,5ul>>((NoInfer<kj::CappedArray<char,_5UL>_> *)local_18);
  fill<kj::CappedArray<char,5ul>>(__return_storage_ptr__,pos,0,pCVar2);
  return __return_storage_ptr__;
}

Assistant:

StringTree StringTree::concat(Params&&... params) {
  StringTree result;
  result.size_ = _::sum({params.size()...});
  result.text = heapString(
      _::sum({StringTree::flatSize(kj::fwd<Params>(params))...}));
  result.branches = heapArray<StringTree::Branch>(
      _::sum({StringTree::branchCount(kj::fwd<Params>(params))...}));
  result.fill(result.text.begin(), 0, kj::fwd<Params>(params)...);
  return result;
}